

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binning.c
# Opt level: O0

double inform_range(double *series,size_t n,double *min,double *max,inform_error *err)

{
  ulong local_50;
  size_t i;
  double b;
  double a;
  inform_error *err_local;
  double *max_local;
  double *min_local;
  size_t n_local;
  double *series_local;
  
  if (series == (double *)0x0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ETIMESERIES;
    }
    series_local = (double *)0x0;
  }
  else if (n == 0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ESHORTSERIES;
    }
    series_local = (double *)0x0;
  }
  else {
    b = *series;
    i = (size_t)*series;
    for (local_50 = 1; local_50 < n; local_50 = local_50 + 1) {
      if (series[local_50] < b) {
        b = series[local_50];
      }
      if ((double)i < series[local_50]) {
        i = (size_t)series[local_50];
      }
    }
    if (min != (double *)0x0) {
      *min = b;
    }
    if (max != (double *)0x0) {
      *max = (double)i;
    }
    series_local = (double *)((double)i - b);
  }
  return (double)series_local;
}

Assistant:

double inform_range(double const *series, size_t n, double *min, double *max,
    inform_error *err)
{
    if (series == NULL)
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, 0.0);
    else if (n == 0)
        INFORM_ERROR_RETURN(err, INFORM_ESHORTSERIES, 0.0);

    double a = series[0], b = series[0];
    for (size_t i = 1; i < n; ++i)
    {
        if (series[i] < a) a = series[i];
        if (b < series[i]) b = series[i];
    }
    if (min != NULL) *min = a;
    if (max != NULL) *max = b;
    return (b - a);
}